

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall QMetaStringTable::enter(QMetaStringTable *this,QByteArray *value)

{
  Span *pSVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  iterator iVar4;
  int pos;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = QHash<QByteArray,_int>::findImpl<QByteArray>(&this->m_entries,value);
  if (iVar4.i.d == (Data<QHashPrivate::Node<QByteArray,_int>_> *)0x0 && iVar4.i.bucket == 0) {
    local_24 = this->m_index;
    QHash<QByteArray,int>::emplace<int_const&>((QHash<QByteArray,int> *)this,value,&local_24);
    this->m_index = this->m_index + 1;
    iVar2 = local_24;
  }
  else {
    pSVar1 = (iVar4.i.d)->spans;
    uVar3 = iVar4.i.bucket >> 7;
    iVar2 = *(int *)(pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)iVar4.i.bucket & 0x7f]].
                     storage.data + 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaStringTable::enter(const QByteArray &value)
{
    Entries::iterator it = m_entries.find(value);
    if (it != m_entries.end())
        return it.value();
    int pos = m_index;
    m_entries.insert(value, pos);
    ++m_index;
    return pos;
}